

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O1

int ffgknjj(fitsfile *fptr,char *keyname,int nstart,int nmax,LONGLONG *value,int *nfound,int *status
           )

{
  char *__src;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  __int32_t **pp_Var4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  long ival;
  int tstatus;
  int nkeys;
  int mkeys;
  char keyindex [8];
  char keyroot [75];
  char svalue [71];
  char comm [73];
  char card [81];
  long local_1b0;
  int local_1a8;
  int local_1a4;
  int *local_1a0;
  long local_198;
  LONGLONG *local_190;
  int local_184;
  char local_180 [8];
  char local_178 [80];
  char local_128 [80];
  char local_d8 [80];
  char local_88 [88];
  
  iVar9 = *status;
  if (iVar9 < 1) {
    *nfound = 0;
    local_178[0] = '\0';
    local_190 = value;
    strncat(local_178,keyname,0x4a);
    sVar3 = strlen(local_178);
    uVar8 = (uint)sVar3;
    if (uVar8 != 0) {
      local_1a0 = nfound;
      if (0 < (int)uVar8) {
        pp_Var4 = __ctype_toupper_loc();
        uVar6 = 0;
        do {
          local_178[uVar6] = (char)(*pp_Var4)[local_178[uVar6]];
          uVar6 = uVar6 + 1;
        } while ((uVar8 & 0x7fffffff) != uVar6);
      }
      ffghps(fptr,&local_1a4,&local_184,status);
      ffmaky(fptr,3,status);
      if (2 < local_1a4) {
        __src = local_88 + (int)uVar8;
        local_198 = (long)(nstart + nmax + -1);
        lVar7 = (long)nstart;
        bVar1 = false;
        iVar9 = 2;
        do {
          iVar2 = ffgnky(fptr,local_88,status);
          if (0 < iVar2) {
            return *status;
          }
          iVar2 = strncmp(local_178,local_88,(long)(int)uVar8);
          if (iVar2 == 0) {
            local_180[0] = '\0';
            pcVar5 = strchr(local_88,0x3d);
            if (pcVar5 != (char *)0x0) {
              sVar3 = (long)pcVar5 - (long)__src;
              if (7 < (long)sVar3) {
                *status = 0xcf;
                return 0xcf;
              }
              strncat(local_180,__src,sVar3);
              local_1a8 = 0;
              iVar2 = ffc2ii(local_180,&local_1b0,&local_1a8);
              if ((iVar2 < 1) && (lVar7 <= local_1b0 && local_1b0 <= local_198)) {
                ffpsvc(local_88,local_128,local_d8,status);
                ffc2j(local_128,local_190 + (local_1b0 - lVar7),status);
                if ((long)*local_1a0 <= local_1b0 - lVar7) {
                  *local_1a0 = (int)(local_1b0 - lVar7) + 1;
                }
                if (*status == 0xcc) {
                  *status = 0;
                  bVar1 = true;
                }
              }
            }
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 < local_1a4);
        if ((bVar1) && (*status < 1)) {
          *status = 0xcc;
        }
      }
    }
    iVar9 = *status;
  }
  return iVar9;
}

Assistant:

int ffgknjj( fitsfile *fptr,    /* I - FITS file pointer                    */
            const char *keyname,      /* I - root name of keywords to read        */
            int  nstart,        /* I - starting index number                */
            int  nmax,          /* I - maximum number of keywords to return */
            LONGLONG *value,    /* O - array of keyword values              */
            int  *nfound,       /* O - number of values that were returned  */
            int  *status)       /* IO - error status                        */
/*
  Read (get) an indexed array of keywords with index numbers between
  NSTART and (NSTART + NMAX -1) inclusive.  
*/
{
    int nend, lenroot, ii, nkeys, mkeys, tstatus, undefinedval;
    long ival;
    char keyroot[FLEN_KEYWORD], keyindex[8], card[FLEN_CARD];
    char svalue[FLEN_VALUE], comm[FLEN_COMMENT], *equalssign;

    if (*status > 0)
        return(*status);

    *nfound = 0;
    nend = nstart + nmax - 1;

    keyroot[0] = '\0';
    strncat(keyroot, keyname, FLEN_KEYWORD - 1);

    lenroot = strlen(keyroot);
    
    if (lenroot == 0)     /*  root must be at least 1 char long  */
        return(*status);

    for (ii=0; ii < lenroot; ii++)           /*  make sure upper case  */
        keyroot[ii] = toupper(keyroot[ii]);

    ffghps(fptr, &nkeys, &mkeys, status);  /*  get the number of keywords  */

    ffmaky(fptr, 3, status);  /* move to 3rd keyword (skip 1st 2 keywords) */

    undefinedval = FALSE;
    for (ii=3; ii <= nkeys; ii++)  
    {
       if (ffgnky(fptr, card, status) > 0)     /*  get next keyword  */
           return(*status);

       if (strncmp(keyroot, card, lenroot) == 0)  /* see if keyword matches */
       {
          keyindex[0] = '\0';
          equalssign = strchr(card, '=');
	  if (equalssign == 0) continue;  /* keyword has no value */

          if (equalssign - card - lenroot > 7)
          {
             return (*status=BAD_KEYCHAR);
          }
          strncat(keyindex, &card[lenroot], equalssign - card  - lenroot);  /*  copy suffix  */

          tstatus = 0;
          if (ffc2ii(keyindex, &ival, &tstatus) <= 0)     /*  test suffix  */
          {
             if (ival <= nend && ival >= nstart)
             {
                ffpsvc(card, svalue, comm, status);   /*  parse the value */
                ffc2j(svalue, &value[ival-nstart], status);  /* convert */
                if (ival - nstart + 1 > *nfound)
                      *nfound = ival - nstart + 1;  /*  max found */ 

                if (*status == VALUE_UNDEFINED)
                {
                    undefinedval = TRUE;
                   *status = 0;  /* reset status to read remaining values */
                }
             }
          }
       }
    }
    if (undefinedval && (*status <= 0) )
        *status = VALUE_UNDEFINED;  /* report at least 1 value undefined */

    return(*status);
}